

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# append_graph.cpp
# Opt level: O0

void handlegraph::algorithms::append_path_handle_graph
               (PathHandleGraph *from,MutablePathMutableHandleGraph *into,
               bool only_connect_path_tips)

{
  bool bVar1;
  byte bVar2;
  reference phVar3;
  byte in_DL;
  long *in_RSI;
  anon_class_16_2_3f20a88f *in_RDI;
  handle_t tail;
  iterator __end3;
  iterator __begin3;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *__range3;
  handle_t into_head;
  handle_t head;
  iterator __end2;
  iterator __begin2;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *__range2;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> tails;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> heads;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *in_stack_fffffffffffffea8;
  __normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
  *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *in_stack_fffffffffffffec0;
  HandleGraph *in_stack_fffffffffffffed8;
  anon_class_16_2_3f20a88f *iteratee;
  PathHandleGraph *this;
  undefined8 local_d8;
  handle_t *local_d0;
  __normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
  local_c8;
  undefined1 *local_c0;
  undefined8 local_b8;
  __normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
  *local_b0;
  undefined8 local_a8;
  handle_t *local_a0;
  __normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
  local_98;
  undefined1 *local_90;
  undefined1 local_48 [24];
  undefined1 local_30 [31];
  byte local_11;
  long *local_10;
  anon_class_16_2_3f20a88f *local_8;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::vector
            ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)0x2433cf);
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::vector
            ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)0x2433dc);
  if ((local_11 & 1) == 0) {
    head_nodes(in_stack_fffffffffffffed8);
    std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::operator=
              (in_stack_fffffffffffffec0,
               (vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)
               CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::~vector
              (in_stack_fffffffffffffec0);
    tail_nodes(in_stack_fffffffffffffed8);
    std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::operator=
              (in_stack_fffffffffffffec0,
               (vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)
               CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::~vector
              (in_stack_fffffffffffffec0);
  }
  this = (PathHandleGraph *)0x0;
  if (local_8 != (anon_class_16_2_3f20a88f *)0x0) {
    this = (PathHandleGraph *)((long)&local_8->from + (long)local_8->from[-0x16]);
  }
  iteratee = local_8;
  copy_handle_graph((HandleGraph *)this,(MutableHandleGraph *)local_8);
  local_90 = local_30;
  local_98._M_current =
       (handle_t *)
       std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::begin
                 (in_stack_fffffffffffffea8);
  local_a0 = (handle_t *)
             std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::end
                       (in_stack_fffffffffffffea8);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_fffffffffffffeb0,
                            (__normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
                             *)in_stack_fffffffffffffea8), bVar1) {
    phVar3 = __gnu_cxx::
             __normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
             ::operator*(&local_98);
    local_a8 = *(undefined8 *)phVar3->data;
    in_stack_fffffffffffffec0 =
         (vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)
         ((long)local_10 + *(long *)(*local_10 + -0xb0));
    local_b8 = (**(code **)(*(long *)((long)&local_8->from + (long)local_8->from[-0x16]) + 0x20))
                         ((long)&local_8->from + (long)local_8->from[-0x16],&local_a8);
    bVar2 = (**(code **)(*(long *)((long)&local_8->from + (long)local_8->from[-0x16]) + 0x28))
                      ((long)&local_8->from + (long)local_8->from[-0x16],&local_a8);
    in_stack_fffffffffffffeb0 =
         (__normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
          *)(**(code **)(in_stack_fffffffffffffec0->
                        super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>
                        )._M_impl.super__Vector_impl_data._M_start[3].data)
                      (in_stack_fffffffffffffec0,&local_b8,bVar2 & 1);
    local_c0 = local_48;
    local_b0 = in_stack_fffffffffffffeb0;
    local_c8._M_current =
         (handle_t *)
         std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::begin
                   (in_stack_fffffffffffffea8);
    local_d0 = (handle_t *)
               std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::end
                         (in_stack_fffffffffffffea8);
    while (bVar1 = __gnu_cxx::operator!=
                             (in_stack_fffffffffffffeb0,
                              (__normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
                               *)in_stack_fffffffffffffea8), bVar1) {
      phVar3 = __gnu_cxx::
               __normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
               ::operator*(&local_c8);
      local_d8 = *(undefined8 *)phVar3->data;
      (**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0x1d0)) + 0xb0))
                ((long)local_10 + *(long *)(*local_10 + -0x1d0),&local_d8,&local_b0);
      __gnu_cxx::
      __normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
      ::operator++(&local_c8);
    }
    __gnu_cxx::
    __normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
    ::operator++(&local_98);
  }
  PathHandleGraph::
  for_each_path_handle<handlegraph::algorithms::append_path_handle_graph(handlegraph::PathHandleGraph_const*,handlegraph::MutablePathMutableHandleGraph*,bool)::__0>
            (this,iteratee);
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::~vector
            (in_stack_fffffffffffffec0);
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::~vector
            (in_stack_fffffffffffffec0);
  return;
}

Assistant:

void append_path_handle_graph(const PathHandleGraph* from, MutablePathMutableHandleGraph* into,
                              bool only_connect_path_tips) {

    // get the heads and tails before copying
    vector<handle_t> heads;
    vector<handle_t> tails;
    if (!only_connect_path_tips) {
        heads = algorithms::head_nodes(from);
        tails = algorithms::tail_nodes(into);
    }

    // copy over the nodes and edges
    // beware: no checking duplicates
    copy_handle_graph(from, into);
    
    // connect all the tips
    for (handle_t head : heads) {
        handle_t into_head = into->get_handle(from->get_id(head), from->get_is_reverse(head));
        for (handle_t tail : tails) {
            into->create_edge(tail, into_head);
        }
    }

    // append the paths, adding linking edges
    from->for_each_path_handle([&](const path_handle_t& path_handle) {
            string path_name = from->get_path_name(path_handle);
            if (!into->has_path(path_name)) {
                // just copy it over if it's not there
                copy_path(from, path_handle, into);
            } else {
                // else we append it
                path_handle_t into_path_handle = into->get_path_handle(path_name);
                
                // add the missing edge
                handle_t tail = into->get_handle_of_step(into->path_back(into_path_handle));
                handle_t head = from->get_handle_of_step(from->path_begin(path_handle));
                if (!into->has_edge(tail, head)) {
                    into->create_edge(tail, head);
                }
                
                // append the steps
                from->for_each_step_in_path(path_handle, [&](const step_handle_t& step_handle) {
                        handle_t handle = from->get_handle_of_step(step_handle);
                        handle_t into_handle = into->get_handle(from->get_id(handle), from->get_is_reverse(handle));
                        into->append_step(into_path_handle, into_handle);
                    });
            }                    
        });
    
}